

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O1

shared_ptr<duckdb::BaseFileReader,_true> __thiscall
duckdb::CSVMultiFileInfo::CreateReader
          (CSVMultiFileInfo *this,ClientContext *context,GlobalTableFunctionState *gstate_p,
          OpenFileInfo *file,idx_t file_idx,MultiFileBindData *bind_data)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  CSVFileScan *pCVar2;
  int iVar3;
  pointer pTVar4;
  MultiFileList *pMVar5;
  CSVBufferManager *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar6;
  shared_ptr<duckdb::BaseFileReader,_true> sVar7;
  bool local_48b;
  bool local_48a;
  undefined1 local_489;
  shared_ptr<duckdb::CSVBufferManager,_true> buffer_manager;
  CSVFileScan *local_470;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_468;
  GlobalTableFunctionState *local_460;
  string local_458;
  CSVReaderOptions options;
  
  pTVar4 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
           ::operator->(&bind_data->bind_data);
  CSVReaderOptions::CSVReaderOptions(&options,(CSVReaderOptions *)(pTVar4 + 1));
  pMVar5 = shared_ptr<duckdb::MultiFileList,_true>::operator->(&bind_data->file_list);
  iVar3 = (*pMVar5->_vptr_MultiFileList[5])(pMVar5);
  if ((char)iVar3 == '\x01') {
    options.auto_detect = false;
  }
  buffer_manager.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  buffer_manager.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (file_idx != 0) goto LAB_0153ca33;
  shared_ptr<duckdb::CSVBufferManager,_true>::operator=
            (&buffer_manager,(shared_ptr<duckdb::CSVBufferManager,_true> *)(pTVar4 + 0x23));
  peVar1 = buffer_manager.internal.
           super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_460 = gstate_p;
  if (buffer_manager.internal.
      super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
LAB_0153c9f8:
    bVar6 = false;
  }
  else {
    this_01 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&buffer_manager);
    CSVBufferManager::GetFilePath_abi_cxx11_(&local_458,this_01);
    bVar6 = true;
    if (local_458._M_string_length == (file->path)._M_string_length) {
      if (local_458._M_string_length == 0) goto LAB_0153c9f8;
      iVar3 = bcmp(local_458._M_dataplus._M_p,(file->path)._M_dataplus._M_p,
                   local_458._M_string_length);
      bVar6 = iVar3 != 0;
    }
  }
  if ((peVar1 != (element_type *)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2)) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  gstate_p = local_460;
  this_00._M_pi =
       buffer_manager.internal.
       super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (bVar6) {
    buffer_manager.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    buffer_manager.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
  }
LAB_0153ca33:
  local_48a = *(bool *)((long)&gstate_p[7]._vptr_GlobalTableFunctionState + 1);
  local_48b = false;
  local_470 = (CSVFileScan *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVFileScan,std::allocator<duckdb::CSVFileScan>,duckdb::ClientContext&,duckdb::OpenFileInfo_const&,duckdb::CSVReaderOptions,duckdb::MultiFileOptions_const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::CSVSchema&,bool,duckdb::shared_ptr<duckdb::CSVBufferManager,true>,bool>
            (&local_468,&local_470,(allocator<duckdb::CSVFileScan> *)&local_489,context,file,
             &options,&bind_data->file_options,&bind_data->names,&bind_data->types,
             (CSVSchema *)&pTVar4[0x24].column_ids,&local_48a,&buffer_manager,&local_48b);
  pCVar2 = local_470;
  if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_468._M_pi)->_M_use_count = (local_468._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_468._M_pi)->_M_use_count = (local_468._M_pi)->_M_use_count + 1;
    }
  }
  if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468._M_pi);
  }
  *(CSVFileScan **)this = pCVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_468._M_pi;
  if (buffer_manager.internal.
      super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (buffer_manager.internal.
               super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  CSVReaderOptions::~CSVReaderOptions(&options);
  sVar7.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar7.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BaseFileReader,_true>)
         sVar7.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BaseFileReader> CSVMultiFileInfo::CreateReader(ClientContext &context, GlobalTableFunctionState &gstate_p,
                                                          const OpenFileInfo &file, idx_t file_idx,
                                                          const MultiFileBindData &bind_data) {
	auto &gstate = gstate_p.Cast<CSVGlobalState>();
	auto &csv_data = bind_data.bind_data->Cast<ReadCSVData>();

	auto options = csv_data.options;
	if (bind_data.file_list->GetExpandResult() == FileExpandResult::SINGLE_FILE) {
		options.auto_detect = false;
	}

	shared_ptr<CSVBufferManager> buffer_manager;
	if (file_idx == 0) {
		buffer_manager = csv_data.buffer_manager;
		if (buffer_manager && buffer_manager->GetFilePath() != file.path) {
			buffer_manager.reset();
		}
	}
	return make_shared_ptr<CSVFileScan>(context, file, std::move(options), bind_data.file_options, bind_data.names,
	                                    bind_data.types, csv_data.csv_schema, gstate.SingleThreadedRead(),
	                                    std::move(buffer_manager), false);
}